

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecompbase.cpp
# Opt level: O0

void __thiscall lzham::CLZDecompBase::init_position_slots(CLZDecompBase *this,uint dict_size_log2)

{
  undefined4 in_ESI;
  undefined4 *in_RDI;
  int i_1;
  uint largest_dist;
  int j;
  int i;
  uint in_stack_000001c4;
  char *in_stack_000001c8;
  char *in_stack_000001d0;
  int local_1c;
  int local_14;
  int local_10;
  
  *in_RDI = in_ESI;
  in_RDI[1] = 1 << ((byte)in_ESI & 0x1f);
  local_14 = 0;
  for (local_10 = 0; local_10 < 0x80; local_10 = local_10 + 2) {
    *(char *)((long)in_RDI + (long)local_10 + 0x40c) = (char)local_14;
    *(char *)((long)in_RDI + (long)(local_10 + 1) + 0x40c) = (char)local_14;
    if ((local_10 != 0) && (local_14 < 0x19)) {
      local_14 = local_14 + 1;
    }
  }
  local_14 = 0;
  for (local_10 = 0; local_10 < 0x80; local_10 = local_10 + 1) {
    in_RDI[(long)local_10 + 3] = local_14;
    in_RDI[(long)local_10 + 0x83] =
         (1 << (*(byte *)((long)in_RDI + (long)local_10 + 0x40c) & 0x1f)) + -1;
    local_14 = (1 << (*(byte *)((long)in_RDI + (long)local_10 + 0x40c) & 0x1f)) + local_14;
  }
  in_RDI[2] = 0;
  local_1c = 0;
  do {
    if (0x7f < local_1c) {
LAB_00133f15:
      if (in_RDI[2] == 0) {
        lzham_assert(in_stack_000001d0,in_stack_000001c8,in_stack_000001c4);
      }
      return;
    }
    if (((uint)in_RDI[(long)local_1c + 3] <= in_RDI[1] - 1) &&
       (in_RDI[1] - 1 <
        (uint)(in_RDI[(long)local_1c + 3] +
              (1 << (*(byte *)((long)in_RDI + (long)local_1c + 0x40c) & 0x1f))))) {
      in_RDI[2] = local_1c + 1;
      goto LAB_00133f15;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void CLZDecompBase::init_position_slots(uint dict_size_log2)
   {
      m_dict_size_log2 = dict_size_log2;
      m_dict_size = 1U << dict_size_log2;
      
      int i, j;
      for (i = 0, j = 0; i < cLZXMaxPositionSlots; i += 2) 
      {
         m_lzx_position_extra_bits[i] = (uint8)j;
         m_lzx_position_extra_bits[i + 1] = (uint8)j; 

         if ((i != 0) && (j < 25))  
            j++; 
      }

      for (i = 0, j = 0; i < cLZXMaxPositionSlots; i++) 
      {
         m_lzx_position_base[i] = j;
         m_lzx_position_extra_mask[i] = (1 << m_lzx_position_extra_bits[i]) - 1;
         j += (1 << m_lzx_position_extra_bits[i]);
      }

      m_num_lzx_slots = 0;         
      
      const uint largest_dist = m_dict_size - 1;
      for (int i = 0; i < cLZXMaxPositionSlots; i++)
      {
         if ( (largest_dist >= m_lzx_position_base[i]) &&
              (largest_dist < (m_lzx_position_base[i] + (1 << m_lzx_position_extra_bits[i])) ) )
         {
            m_num_lzx_slots = i + 1;
            break;
         }              
      }
      
      LZHAM_VERIFY(m_num_lzx_slots);
   }